

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cc
# Opt level: O3

void __thiscall brown::App::appEventHandle(App *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  SDL_Event event;
  int local_48 [4];
  char local_38;
  int local_34;
  undefined4 uStack_30;
  undefined8 local_2c;
  
  this->dmousx = 0;
  this->dmousy = 0;
  iVar3 = SDL_PollEvent(local_48);
  do {
    if (iVar3 == 0) {
      return;
    }
    if (local_48[0] < 0x400) {
      if (local_48[0] == 0x100) {
LAB_001038c6:
        this->isBreak = true;
      }
      else if (local_48[0] == 0x300) {
        if (local_34 == 0x40000050) {
          this->keystatus[0xcb] = '\x01';
        }
        else if (local_34 == 0x4000004f) {
          this->keystatus[0xcd] = '\x01';
        }
        else {
LAB_001038c1:
          if (local_34 == 0x1b) goto LAB_001038c6;
        }
      }
      else if (local_48[0] == 0x301) {
        if (local_34 == 0x40000050) {
          this->keystatus[0xcb] = '\0';
        }
        else {
          if (local_34 != 0x4000004f) goto LAB_001038c1;
          this->keystatus[0xcd] = '\0';
        }
      }
    }
    else if (local_48[0] == 0x400) {
      this->mousx = local_34;
      this->mousy = uStack_30;
      uVar1 = this->dmousx;
      uVar2 = this->dmousy;
      this->dmousx = uVar1 + (int)local_2c;
      this->dmousy = uVar2 + (int)((ulong)local_2c >> 0x20);
    }
    else if (local_48[0] == 0x401) {
      if (local_38 == '\x03') {
        *(byte *)&this->bstatus = (byte)this->bstatus | 2;
      }
      else if (local_38 == '\x02') {
        *(byte *)&this->bstatus = (byte)this->bstatus | 4;
      }
      else if (local_38 == '\x01') {
        *(byte *)&this->bstatus = (byte)this->bstatus | 1;
      }
    }
    else if (local_48[0] == 0x402) {
      if (local_38 == '\x03') {
        *(byte *)&this->bstatus = (byte)this->bstatus & 0xfd;
      }
      else if (local_38 == '\x02') {
        *(byte *)&this->bstatus = (byte)this->bstatus & 0xfb;
      }
      else if (local_38 == '\x01') {
        *(byte *)&this->bstatus = (byte)this->bstatus & 0xfe;
      }
    }
    iVar3 = SDL_PollEvent(local_48);
  } while( true );
}

Assistant:

void App::appEventHandle() {
    SDL_Event event;
    dmousx = 0; dmousy = 0;
    while (SDL_PollEvent(&event)) {
        switch (event.type) {
            case SDL_KEYDOWN:
                if (event.key.keysym.sym == SDLK_ESCAPE) {isBreak = 1;}
                if (event.key.keysym.sym == SDLK_LEFT ) {keystatus[0xcb] = 1;}
                if (event.key.keysym.sym == SDLK_RIGHT) {keystatus[0xcd] = 1;}
                break;
            case SDL_KEYUP:
                if (event.key.keysym.sym == SDLK_ESCAPE) {isBreak = 1;}
                if (event.key.keysym.sym == SDLK_LEFT ) {keystatus[0xcb] = 0;}
                if (event.key.keysym.sym == SDLK_RIGHT) {keystatus[0xcd] = 0;}
                break;
            case SDL_MOUSEMOTION:
                mousx = event.motion.x; dmousx += event.motion.xrel;
                mousy = event.motion.y; dmousy += event.motion.yrel;
                break;
            case SDL_MOUSEBUTTONDOWN:
                switch (event.button.button) {
                    case SDL_BUTTON_LEFT:   bstatus |= 1<<0; break;
                    case SDL_BUTTON_RIGHT:  bstatus |= 1<<1; break;
                    case SDL_BUTTON_MIDDLE: bstatus |= 1<<2; break;
                }
                break;
            case SDL_MOUSEBUTTONUP:
                switch (event.button.button) {
                    case SDL_BUTTON_LEFT:   bstatus &= ~(1<<0); break;
                    case SDL_BUTTON_RIGHT:  bstatus &= ~(1<<1); break;
                    case SDL_BUTTON_MIDDLE: bstatus &= ~(1<<2); break;
                }
                break;
            case SDL_QUIT:
                isBreak = true; break;
        }
    }
}